

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void liblogger::LogManager::FilterAdd(ILogFilter *filter)

{
  LogManagerScopedLock lock;
  shared_ptr<liblogger::ILogFilter> ptr;
  shared_ptr<liblogger::ILogFilter> local_28;
  ILogFilter *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  LogMutex::Lock((LogMutex *)m_mutex);
  local_18 = filter;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<liblogger::ILogFilter*>
            (&local_10,filter);
  local_28.super___shared_ptr<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
  local_28.super___shared_ptr<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_10._M_pi;
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
    }
  }
  FilterAdd(&local_28);
  if (local_28.super___shared_ptr<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10._M_pi);
  }
  LogMutex::Unlock((LogMutex *)m_mutex);
  return;
}

Assistant:

void LogManager::FilterAdd(ILogFilter *filter)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	std::shared_ptr<ILogFilter> ptr(filter);
	FilterAdd(ptr);
}